

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void array_suite::fail_too_long(void)

{
  error *ex;
  bool local_b4 [4];
  undefined1 local_b0 [4];
  bool value [4];
  iarchive in;
  value_type input [8];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x9380818081800492;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[8]>
            ((iarchive *)local_b0,
             (uchar (*) [8])
             ((long)&in.reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data + 0x48));
  local_b4[0] = false;
  local_b4[1] = false;
  local_b4[2] = false;
  local_b4[3] = false;
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)local_b0,&local_b4);
  trial::protocol::core::detail::throw_failed_impl
            ("in >> value","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x11e,"void array_suite::fail_too_long()");
  trial::protocol::bintoken::iarchive::~iarchive((iarchive *)local_b0);
  return;
}

Assistant:

void fail_too_long()
{
    const value_type input[] = { token::code::begin_array,
                                 0x04,
                                 0x80, 0x81, 0x80, 0x81, 0x80,
                                 token::code::end_array };
    format::iarchive in(input);
    bool value[4] = { false, false, false, false };
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(in >> value,
                                    format::error, "expected end array bracket");
}